

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int duckdb_re2::Fanout(Prog *prog,vector<int,_std::allocator<int>_> *histogram)

{
  iterator pIVar1;
  int iVar2;
  iterator pIVar3;
  int *piVar4;
  uint32_t *puVar5;
  long in_RSI;
  Prog *in_RDI;
  int bucket;
  uint32_t value;
  iterator i;
  int size;
  int data [32];
  SparseArray<int> fanout;
  SparseArray<int> *in_stack_00000158;
  Prog *in_stack_00000160;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  SparseArray<int> *in_stack_fffffffffffffee0;
  int local_e4;
  int local_e0;
  uint local_dc;
  iterator local_d8;
  int local_cc;
  int local_c8 [46];
  long local_10;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_10 = in_RSI;
  Prog::size(in_RDI);
  SparseArray<int>::SparseArray(in_stack_fffffffffffffee0,iVar2);
  Prog::Fanout(in_stack_00000160,in_stack_00000158);
  local_c8[0x1c] = 0;
  local_c8[0x1d] = 0;
  local_c8[0x1e] = 0;
  local_c8[0x1f] = 0;
  local_c8[0x18] = 0;
  local_c8[0x19] = 0;
  local_c8[0x1a] = 0;
  local_c8[0x1b] = 0;
  local_c8[0x14] = 0;
  local_c8[0x15] = 0;
  local_c8[0x16] = 0;
  local_c8[0x17] = 0;
  local_c8[0x10] = 0;
  local_c8[0x11] = 0;
  local_c8[0x12] = 0;
  local_c8[0x13] = 0;
  local_c8[0xc] = 0;
  local_c8[0xd] = 0;
  local_c8[0xe] = 0;
  local_c8[0xf] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  local_c8[10] = 0;
  local_c8[0xb] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_cc = 0;
  for (local_d8 = SparseArray<int>::begin((SparseArray<int> *)0x805e69); pIVar1 = local_d8,
      pIVar3 = SparseArray<int>::end
                         ((SparseArray<int> *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)),
      pIVar1 != pIVar3; local_d8 = local_d8 + 1) {
    piVar4 = SparseArray<int>::IndexValue::value(local_d8);
    if (*piVar4 != 0) {
      puVar5 = (uint32_t *)SparseArray<int>::IndexValue::value(local_d8);
      local_dc = *puVar5;
      in_stack_fffffffffffffed4 = FindMSBSet(local_dc);
      local_e0 = (in_stack_fffffffffffffed4 + 1) - (uint)((local_dc & local_dc - 1) == 0);
      local_c8[local_e0] = local_c8[local_e0] + 1;
      local_e4 = local_e0 + 1;
      in_stack_fffffffffffffec8 = Catch::clara::std::max<int>(&local_cc,&local_e4);
      local_cc = *in_stack_fffffffffffffec8;
    }
  }
  if (local_10 != 0) {
    std::vector<int,std::allocator<int>>::assign<int*,void>
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,
               (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  iVar2 = local_cc + -1;
  SparseArray<int>::~SparseArray((SparseArray<int> *)CONCAT44(iVar2,in_stack_fffffffffffffec0));
  return iVar2;
}

Assistant:

static int Fanout(Prog* prog, std::vector<int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  int data[32] = {};
  int size = 0;
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    if (i->value() == 0)
      continue;
    uint32_t value = i->value();
    int bucket = FindMSBSet(value);
    bucket += value & (value-1) ? 1 : 0;
    ++data[bucket];
    size = std::max(size, bucket+1);
  }
  if (histogram != NULL)
    histogram->assign(data, data+size);
  return size-1;
}